

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_substr(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint max;
  JSValue v;
  JSValue JVar2;
  int n;
  int local_38;
  int a;
  
  v = JS_ToStringCheckObject(ctx,this_val);
  if ((int)v.tag == 6) {
    return v;
  }
  max = *(uint *)((long)v.u.ptr + 4) & 0x7fffffff;
  iVar1 = JS_ToInt32Clamp(ctx,&a,*argv,0,max,max);
  if (iVar1 == 0) {
    n = max - a;
    if ((int)argv[1].tag != 3) {
      local_38 = a;
      JVar2.tag = argv[1].tag;
      JVar2.u.ptr = argv[1].u.ptr;
      iVar1 = JS_ToInt32Clamp(ctx,&n,JVar2,0,n,0);
      a = local_38;
      if (iVar1 != 0) goto LAB_00158c76;
    }
    JVar2 = js_sub_string(ctx,(JSString *)v.u.ptr,a,n + a);
  }
  else {
LAB_00158c76:
    JVar2 = (JSValue)(ZEXT816(6) << 0x40);
  }
  JS_FreeValue(ctx,v);
  return JVar2;
}

Assistant:

static JSValue js_string_substr(JSContext *ctx, JSValueConst this_val,
                                int argc, JSValueConst *argv)
{
    JSValue str, ret;
    int a, len, n;
    JSString *p;

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        return str;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (JS_ToInt32Clamp(ctx, &a, argv[0], 0, len, len)) {
        JS_FreeValue(ctx, str);
        return JS_EXCEPTION;
    }
    n = len - a;
    if (!JS_IsUndefined(argv[1])) {
        if (JS_ToInt32Clamp(ctx, &n, argv[1], 0, len - a, 0)) {
            JS_FreeValue(ctx, str);
            return JS_EXCEPTION;
        }
    }
    ret = js_sub_string(ctx, p, a, a + n);
    JS_FreeValue(ctx, str);
    return ret;
}